

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qmakeevaluator.cpp
# Opt level: O0

void __thiscall QMakeEvaluator::traceMsgInternal(QMakeEvaluator *this,char *fmt,...)

{
  FILE *__stream;
  char *pcVar1;
  char *in_RSI;
  long in_RDI;
  long in_FS_OFFSET;
  va_list ap;
  ProFile *in_stack_fffffffffffffe98;
  undefined8 *puVar2;
  QString *in_stack_fffffffffffffeb8;
  QString local_88 [2];
  QString local_58 [2];
  undefined8 local_28;
  undefined1 *local_20;
  undefined1 *local_18;
  long local_8;
  
  __stream = _stderr;
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  local_28 = 0xaaaaaaaaaaaaaaaa;
  local_20 = (undefined1 *)0xaaaaaaaaaaaaaaaa;
  local_18 = (undefined1 *)0xaaaaaaaaaaaaaaaa;
  if (*(long *)(in_RDI + 0x10) == 0) {
    fprintf(_stderr,"DEBUG 1: ");
  }
  else if (*(short *)(in_RDI + 0x18) == 0) {
    ProFile::fileName(in_stack_fffffffffffffe98);
    QtPrivate::asString(local_58);
    QString::toLocal8Bit(in_stack_fffffffffffffeb8);
    pcVar1 = QByteArray::constData((QByteArray *)0x2f3f5a);
    fprintf(__stream,"DEBUG 1: %s: ",pcVar1);
    QByteArray::~QByteArray((QByteArray *)0x2f3f7d);
    QString::~QString((QString *)0x2f3f8a);
  }
  else {
    ProFile::fileName(in_stack_fffffffffffffe98);
    QtPrivate::asString(local_88);
    QString::toLocal8Bit(in_stack_fffffffffffffeb8);
    pcVar1 = QByteArray::constData((QByteArray *)0x2f3fde);
    fprintf(__stream,"DEBUG 1: %s:%d: ",pcVar1,(ulong)*(ushort *)(in_RDI + 0x18));
    QByteArray::~QByteArray((QByteArray *)0x2f400a);
    QString::~QString((QString *)0x2f4017);
  }
  local_18 = &stack0xfffffffffffffeb8;
  local_20 = &stack0x00000008;
  local_28 = 0x3000000010;
  puVar2 = (undefined8 *)&stderr;
  vfprintf(_stderr,in_RSI,&local_28);
  fputc(10,(FILE *)*puVar2);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_8) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void QMakeEvaluator::traceMsgInternal(const char *fmt, ...) const
{
    va_list ap;

    if (!m_current.pro)
        fprintf(stderr, "DEBUG 1: ");
    else if (m_current.line <= 0)
        fprintf(stderr, "DEBUG 1: %s: ", qPrintable(m_current.pro->fileName()));
    else
        fprintf(stderr, "DEBUG 1: %s:%d: ", qPrintable(m_current.pro->fileName()), m_current.line);
    va_start(ap, fmt);
    vfprintf(stderr, fmt, ap);
    va_end(ap);
    fputc('\n', stderr);
}